

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

int z80GetRegister8(char *source,int *RetLen)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int unaff_EBP;
  char *__s1;
  long lVar4;
  
  __s1 = "b";
  lVar4 = 0;
  while( true ) {
    sVar1 = *(short *)((long)&Z80Registers8[0].len + lVar4);
    iVar3 = strncmp(__s1,source,(long)sVar1);
    bVar2 = true;
    if (((iVar3 == 0) && ((ulong)(byte)source[sVar1] < 0x2d)) &&
       ((0x120000000001U >> ((ulong)(byte)source[sVar1] & 0x3f) & 1) != 0)) {
      *RetLen = (int)sVar1;
      unaff_EBP = (int)*(short *)((long)&Z80Registers8[0].num + lVar4);
      bVar2 = false;
    }
    if (!bVar2) break;
    __s1 = *(char **)((long)&Z80Registers8[1].name + lVar4);
    lVar4 = lVar4 + 0x10;
    if (lVar4 == 0x80) {
      return -1;
    }
  }
  return unaff_EBP;
}

Assistant:

int z80GetRegister8(char* source, int& RetLen)
{
	for (int z = 0; Z80Registers8[z].name != NULL; z++)
	{
		int len = Z80Registers8[z].len;
		if (strncmp(Z80Registers8[z].name,source,len) == 0)
		{
			switch (source[len])
			{
			case ')': case ',': case 0:
				RetLen = len;
				return Z80Registers8[z].num;
			default:
				break;
			}
		}
	}
	return -1;
}